

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O0

Wlc_Ntk_t *
Wlc_ReadSmtBuffer(char *pFileName,char *pBuffer,char *pLimit,int fOldParser,int fPrintTree)

{
  int iVar1;
  Smt_Prs_t *p_00;
  undefined8 local_50;
  Smt_Prs_t *p;
  Wlc_Ntk_t *pWStack_38;
  int nCount;
  Wlc_Ntk_t *pNtk;
  int fPrintTree_local;
  int fOldParser_local;
  char *pLimit_local;
  char *pBuffer_local;
  char *pFileName_local;
  
  pWStack_38 = (Wlc_Ntk_t *)0x0;
  iVar1 = Smt_PrsRemoveComments(pBuffer,pLimit);
  p_00 = Smt_PrsAlloc(pFileName,pBuffer,pLimit,iVar1);
  if (p_00 == (Smt_Prs_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    Smt_PrsReadLines(p_00);
    if (fPrintTree != 0) {
      Smt_PrsPrintParser(p_00);
    }
    iVar1 = Smt_PrsErrorPrint(p_00);
    if (iVar1 != 0) {
      if (fOldParser == 0) {
        local_50 = Smt_PrsBuild2(p_00);
      }
      else {
        local_50 = Smt_PrsBuild(p_00);
      }
      pWStack_38 = local_50;
    }
    Smt_PrsFree(p_00);
    pFileName_local = (char *)pWStack_38;
  }
  return (Wlc_Ntk_t *)pFileName_local;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadSmtBuffer( char * pFileName, char * pBuffer, char * pLimit, int fOldParser, int fPrintTree )
{
    Wlc_Ntk_t * pNtk = NULL;
    int nCount = Smt_PrsRemoveComments( pBuffer, pLimit );
    Smt_Prs_t * p = Smt_PrsAlloc( pFileName, pBuffer, pLimit, nCount );
    if ( p == NULL )
        return NULL;
    Smt_PrsReadLines( p );
    if ( fPrintTree )
        Smt_PrsPrintParser( p );
    if ( Smt_PrsErrorPrint(p) )
        pNtk = fOldParser ? Smt_PrsBuild(p) : Smt_PrsBuild2(p);
    Smt_PrsFree( p );
    return pNtk;
}